

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O3

Alignment * __thiscall
spoa::SisdAlignmentEngine::Linear
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  char cVar1;
  pointer ppNVar2;
  Implementation *pIVar3;
  int32_t *piVar4;
  Node *pNVar5;
  pointer ppEVar6;
  pointer ppEVar7;
  pointer ppVar8;
  uint uVar9;
  pointer ppVar10;
  uint uVar11;
  long lVar12;
  pointer ppVar13;
  AlignmentType AVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  int32_t iVar28;
  uint uVar29;
  uint local_80;
  uint32_t local_7c;
  ulong local_78;
  int32_t *local_70;
  ulong local_68;
  long local_60;
  int32_t *local_58;
  ulong local_50;
  long local_48;
  pointer local_40;
  pointer local_38;
  ulong uVar30;
  
  AVar14 = (this->super_AlignmentEngine).type_;
  local_40 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppNVar2 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar29 = sequence_len + 1;
  uVar30 = (ulong)uVar29;
  uVar19 = 0x80000400;
  if (AVar14 == kSW) {
    uVar19 = 0;
  }
  if (ppNVar2 == local_40) {
    uVar15 = 0;
    uVar18 = 0;
  }
  else {
    pIVar3 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    iVar16 = (int)(this->super_AlignmentEngine).g_;
    local_60 = uVar30 * 4;
    local_50 = uVar30 - 1;
    uVar18 = 0;
    lVar12 = *(long *)&(pIVar3->node_id_to_rank).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    local_48 = *(long *)&(pIVar3->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl;
    piVar4 = pIVar3->H;
    local_58 = piVar4 + 1;
    local_68 = uVar30 - 2;
    uVar15 = 0;
    do {
      local_78 = uVar15;
      local_38 = ppNVar2;
      pNVar5 = *local_38;
      ppEVar6 = (pNVar5->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppEVar7 = (pNVar5->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppEVar6 == ppEVar7) {
        uVar15 = 0;
      }
      else {
        uVar15 = (ulong)(*(int *)(lVar12 + (ulong)(*ppEVar6)->tail->id * 4) + 1);
      }
      lVar20 = local_48 + pNVar5->code * uVar30 * 4;
      uVar25 = *(int *)(lVar12 + (ulong)pNVar5->id * 4) + 1;
      lVar22 = uVar25 * uVar30;
      if (1 < uVar29) {
        uVar23 = 1;
        do {
          iVar26 = *(int *)(lVar20 + uVar23 * 4) + piVar4[uVar15 * uVar30 + (uVar23 - 1)];
          iVar28 = piVar4[uVar15 * uVar30 + uVar23] + iVar16;
          if (iVar28 < iVar26) {
            iVar28 = iVar26;
          }
          piVar4[lVar22 + uVar23] = iVar28;
          uVar23 = uVar23 + 1;
        } while (uVar30 != uVar23);
      }
      uVar15 = (long)ppEVar7 - (long)ppEVar6 >> 3;
      if (1 < uVar15) {
        uVar23 = 1;
        cVar1 = (this->super_AlignmentEngine).g_;
        do {
          if (1 < uVar29) {
            uVar27 = 1;
            lVar24 = (*(int *)(lVar12 + (ulong)ppEVar6[uVar23]->tail->id * 4) + 1) * uVar30;
            do {
              iVar17 = *(int *)(lVar20 + uVar27 * 4) + piVar4[lVar24 + (uVar27 - 1)];
              iVar26 = piVar4[lVar24 + uVar27] + (int)cVar1;
              if (iVar26 < piVar4[lVar22 + uVar27]) {
                iVar26 = piVar4[lVar22 + uVar27];
              }
              if (iVar26 < iVar17) {
                iVar26 = iVar17;
              }
              piVar4[lVar22 + uVar27] = iVar26;
              uVar27 = uVar27 + 1;
            } while (uVar30 != uVar27);
          }
          uVar23 = (ulong)((int)uVar23 + 1);
        } while (uVar23 < uVar15);
      }
      uVar15 = local_78;
      if (1 < uVar29) {
        lVar20 = (ulong)uVar25 * local_60;
        uVar27 = 1;
        uVar23 = 0;
        do {
          uVar21 = *(uint *)((long)local_58 + uVar23 * 4 + lVar20);
          uVar11 = *(int *)((long)local_58 + uVar23 * 4 + lVar20 + -4) + iVar16;
          if ((int)uVar11 <= (int)uVar21) {
            uVar11 = uVar21;
          }
          *(uint *)((long)local_58 + uVar23 * 4 + lVar20) = uVar11;
          if (AVar14 == kOV) {
            if (((pNVar5->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 (pNVar5->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish) && ((int)uVar19 < (int)uVar11)) {
              uVar18 = (ulong)((int)uVar23 + 1);
              uVar19 = uVar11;
LAB_00122313:
              uVar15 = (ulong)uVar25;
            }
          }
          else if (AVar14 == kNW) {
            if (((local_68 == uVar23) &&
                ((pNVar5->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 (pNVar5->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish)) &&
               ((int)uVar19 < piVar4[lVar22 + (uVar30 - 1)])) {
              uVar18 = local_50 & 0xffffffff;
              uVar19 = piVar4[lVar22 + (uVar30 - 1)];
              goto LAB_00122313;
            }
          }
          else if (AVar14 == kSW) {
            uVar11 = ~((int)uVar11 >> 0x1f) & uVar11;
            *(uint *)((long)local_58 + uVar23 * 4 + lVar20) = uVar11;
            if ((int)uVar19 < (int)uVar11) {
              uVar18 = uVar27 & 0xffffffff;
              uVar19 = uVar11;
              goto LAB_00122313;
            }
          }
          uVar27 = uVar27 + 1;
          uVar23 = uVar23 + 1;
        } while (local_50 != uVar23);
      }
      ppNVar2 = local_38 + 1;
    } while (local_38 + 1 != local_40);
  }
  if ((int)uVar15 == 0 && (int)uVar18 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = uVar19;
  }
  uVar19 = 0;
  uVar29 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = score;
  do {
    uVar21 = (uint)uVar15;
    uVar25 = (uint)uVar18;
    if (AVar14 == kOV) {
      uVar11 = uVar25;
      if (uVar21 == 0) goto LAB_0012264e;
joined_r0x001223f3:
      if (uVar11 == 0) goto LAB_0012264e;
    }
    else {
      if (AVar14 != kNW) {
        if (AVar14 == kSW) {
          uVar11 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl)->H[uVar15 * uVar30 + uVar18];
          goto joined_r0x001223f3;
        }
LAB_0012264e:
        ppVar10 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar8 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        ppVar13 = ppVar8 + -1;
        if (ppVar13 <= ppVar10 || ppVar10 == ppVar8) {
          return __return_storage_ptr__;
        }
        do {
          iVar16 = ppVar10->first;
          ppVar10->first = ppVar13->first;
          ppVar13->first = iVar16;
          iVar16 = ppVar10->second;
          ppVar10->second = ppVar13->second;
          ppVar13->second = iVar16;
          ppVar10 = ppVar10 + 1;
          ppVar13 = ppVar13 + -1;
        } while (ppVar10 < ppVar13);
        return __return_storage_ptr__;
      }
      if (uVar21 == 0 && uVar25 == 0) goto LAB_0012264e;
    }
    pIVar3 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    lVar12 = uVar15 * uVar30;
    piVar4 = pIVar3->H;
    iVar16 = piVar4[lVar12 + uVar18];
    if ((uVar25 == 0) || (uVar21 == 0)) {
LAB_001224f0:
      if (uVar21 != 0) {
        pNVar5 = (graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar21 - 1];
        ppEVar6 = (pNVar5->inedges).
                  super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppEVar7 = *(pointer *)
                   ((long)&(pNVar5->inedges).
                           super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                           ._M_impl + 8);
        if (ppEVar6 == ppEVar7) {
          uVar15 = 0;
        }
        else {
          uVar15 = (ulong)(*(int *)(*(long *)&(pIVar3->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)(*ppEVar6)->tail->id * 4) + 1);
        }
        iVar26 = (int)(this->super_AlignmentEngine).g_;
        uVar11 = uVar25;
        if (iVar16 == piVar4[uVar15 * uVar30 + uVar18] + iVar26) goto LAB_001225e6;
        uVar23 = (long)ppEVar7 - (long)ppEVar6 >> 3;
        if (1 < uVar23) {
          uVar15 = 1;
          uVar9 = 2;
          do {
            uVar15 = (ulong)(*(int *)(*(long *)&(pIVar3->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)ppEVar6[uVar15]->tail->id * 4) + 1);
            if (iVar16 == piVar4[uVar18 + uVar15 * uVar30] + iVar26) goto LAB_001225e6;
            uVar15 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
          } while (uVar15 < uVar23);
        }
      }
      if (iVar16 == (int)(this->super_AlignmentEngine).g_ + piVar4[lVar12 + (uVar18 - 1)]) {
        uVar29 = uVar21;
        uVar19 = uVar25 - 1;
      }
      uVar15 = (ulong)uVar29;
      uVar11 = uVar19;
    }
    else {
      pNVar5 = (graph->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar21 - 1];
      ppEVar6 = (pNVar5->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppEVar7 = *(pointer *)
                 ((long)&(pNVar5->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      if (ppEVar6 == ppEVar7) {
        uVar15 = 0;
      }
      else {
        uVar15 = (ulong)(*(int *)(*(long *)&(pIVar3->node_id_to_rank).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 + (ulong)(*ppEVar6)->tail->id * 4) + 1);
      }
      uVar11 = uVar25 - 1;
      iVar26 = *(int *)(pNVar5->code * uVar30 * 4 +
                        *(long *)&(pIVar3->sequence_profile).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar18 * 4
                       );
      if (iVar16 != piVar4[uVar15 * uVar30 + (ulong)uVar11] + iVar26) {
        uVar23 = (long)ppEVar7 - (long)ppEVar6 >> 3;
        if (1 < uVar23) {
          uVar15 = 1;
          uVar9 = 2;
          do {
            uVar15 = (ulong)(*(int *)(*(long *)&(pIVar3->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)ppEVar6[uVar15]->tail->id * 4) + 1);
            if (iVar16 == piVar4[(ulong)uVar11 + uVar15 * uVar30] + iVar26) goto LAB_001225e6;
            uVar15 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
          } while (uVar15 < uVar23);
        }
        goto LAB_001224f0;
      }
    }
LAB_001225e6:
    uVar19 = uVar11;
    local_7c = 0xffffffff;
    uVar29 = (uint)uVar15;
    if (uVar21 != uVar29) {
      local_7c = (graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar21 - 1]->id;
    }
    local_80 = uVar25 - 1;
    if (uVar25 == uVar19) {
      local_80 = 0xffffffff;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_7c,&local_80);
    AVar14 = (this->super_AlignmentEngine).type_;
    uVar18 = (ulong)uVar19;
  } while( true );
}

Assistant:

Alignment SisdAlignmentEngine::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    // update H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      H_row[j] = std::max(
          H_pred_row[j - 1] + char_profile[j],
          H_pred_row[j] + g_);
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        H_row[j] = std::max(
            H_pred_row[j - 1] + char_profile[j],
            std::max(
                H_row[j],
                H_pred_row[j] + g_));
      }
    }

    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      H_row[j] = std::max(H_row[j - 1] + g_, H_row[j]);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          it->outedges.empty() && j == matrix_width - 1) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && it->outedges.empty()) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;
  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
          pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          std::uint32_t pred_i =
              pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ? 0 :
          pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          std::uint32_t pred_i =
              pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && H_ij == pimpl_->H[i * matrix_width + j - 1] + g_) {  // NOLINT
      prev_i = i;
      prev_j = j - 1;
      predecessor_found = true;
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}